

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator_lite.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::StripProto_abi_cxx11_
          (string *__return_storage_ptr__,compiler *this,string_view filename)

{
  long lVar1;
  size_t sVar2;
  bool bVar3;
  
  sVar2 = filename._M_len;
  if ((this < (compiler *)0xb) ||
     (*(long *)(this + (sVar2 - 8)) != 0x6c657665646f746f ||
      *(long *)(this + (sVar2 - 0xb)) != 0x65646f746f72702e)) {
    if (this < (compiler *)0x6) {
      lVar1 = 0;
      goto LAB_00109518;
    }
    bVar3 = *(short *)(this + (sVar2 - 2)) == 0x6f74 && *(int *)(this + (sVar2 - 6)) == 0x6f72702e;
    lVar1 = -6;
  }
  else {
    bVar3 = *(long *)(this + (sVar2 - 8)) == 0x6c657665646f746f &&
            *(long *)(this + (sVar2 - 0xb)) == 0x65646f746f72702e;
    lVar1 = -0xb;
  }
  if (!bVar3) {
    lVar1 = 0;
  }
LAB_00109518:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,sVar2,this + lVar1 + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string StripProto(absl::string_view filename) {
  if (absl::EndsWith(filename, ".protodevel")) {
    return std::string(absl::StripSuffix(filename, ".protodevel"));
  } else {
    return std::string(absl::StripSuffix(filename, ".proto"));
  }
}